

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
ConfigurationTestNode::Evaluate
          (string *__return_storage_ptr__,ConfigurationTestNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  pointer *suffix_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  GeneratorExpressionContent *context_00;
  bool bVar1;
  int iVar2;
  reference s;
  ulong uVar3;
  char *pcVar4;
  char *rhs;
  const_reference s_00;
  char *local_268;
  char *local_200;
  allocator local_1d1;
  int local_1d0;
  allocator local_1c9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c8;
  string local_1c0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_198;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_190;
  allocator local_181;
  string local_180;
  string local_160;
  char *local_140;
  char *mapValue;
  allocator local_111;
  undefined1 local_110 [8];
  string mapProp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mappedConfigs;
  string suffix;
  char *imp;
  char *loc;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a0;
  allocator local_92;
  allocator local_91;
  string local_90;
  string local_70;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50 [3];
  cmGeneratorExpressionDAGChecker *local_38;
  cmGeneratorExpressionDAGChecker *param_5_local;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  ConfigurationTestNode *this_local;
  
  local_38 = param_4;
  param_5_local = (cmGeneratorExpressionDAGChecker *)content;
  content_local = (GeneratorExpressionContent *)context;
  context_local = (cmGeneratorExpressionContext *)parameters;
  parameters_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  this_local = (ConfigurationTestNode *)__return_storage_ptr__;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(parameters);
  if (bVar1) {
    ConfigurationNode::Evaluate
              (__return_storage_ptr__,&configurationNode,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)context_local,(cmGeneratorExpressionContext *)content_local,
               (GeneratorExpressionContent *)param_5_local,(cmGeneratorExpressionDAGChecker *)0x0);
    return __return_storage_ptr__;
  }
  if ((Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
       ::configValidator == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                   ::configValidator), iVar2 != 0)) {
    cmsys::RegularExpression::RegularExpression(&Evaluate::configValidator,"^[A-Za-z0-9_]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&Evaluate::configValidator,
                 &__dso_handle);
    __cxa_guard_release(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                         ::configValidator);
  }
  local_50[0]._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)context_local);
  s = __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(local_50);
  bVar1 = cmsys::RegularExpression::find(&Evaluate::configValidator,s);
  context_00 = content_local;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_70,(GeneratorExpressionContent *)param_5_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,"Expression syntax not recognized.",&local_91);
    reportError((cmGeneratorExpressionContext *)context_00,&local_70,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  *(undefined1 *)
   ((long)&content_local[5].ParamChildren.
           super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 2) = 1;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)context_local);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      local_200 = "0";
    }
    else {
      local_200 = "1";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_200,&local_92);
    std::allocator<char>::~allocator((allocator<char> *)&local_92);
    return __return_storage_ptr__;
  }
  local_a0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)context_local);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator->(&local_a0);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  rhs = (char *)std::__cxx11::string::c_str();
  iVar2 = cmsysString_strcasecmp(pcVar4,rhs);
  if (iVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"1",(allocator *)((long)&loc + 7))
    ;
    std::allocator<char>::~allocator((allocator<char> *)((long)&loc + 7));
    return __return_storage_ptr__;
  }
  if ((content_local[5].IdentifierChildren.
       super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) ||
     (bVar1 = cmGeneratorTarget::IsImported
                        ((cmGeneratorTarget *)
                         content_local[5].IdentifierChildren.
                         super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage), !bVar1))
  goto LAB_0068421a;
  imp = (char *)0x0;
  suffix.field_2._8_8_ = 0;
  suffix_00 = &mappedConfigs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::string((string *)suffix_00);
  bVar1 = cmTarget::GetMappedConfig
                    ((cmTarget *)
                     *content_local[5].IdentifierChildren.
                      super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (string *)
                     &content_local[4].IdentifierChildren.
                      super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&imp,
                     (char **)((long)&suffix.field_2 + 8),(string *)suffix_00);
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&mapProp.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_110,"MAP_IMPORTED_CONFIG_",&local_111);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    cmsys::SystemTools::UpperCase
              ((string *)&mapValue,
               (string *)
               &content_local[4].IdentifierChildren.
                super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::operator+=((string *)local_110,(string *)&mapValue);
    std::__cxx11::string::~string((string *)&mapValue);
    pcVar4 = cmGeneratorTarget::GetProperty
                       ((cmGeneratorTarget *)
                        content_local[5].IdentifierChildren.
                        super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_110);
    local_140 = pcVar4;
    if (pcVar4 == (char *)0x0) {
      local_1d0 = 0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_180,pcVar4,&local_181);
      cmsys::SystemTools::UpperCase(&local_160,&local_180);
      cmSystemTools::ExpandListArgument
                (&local_160,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&mapProp.field_2 + 8),false);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_180);
      std::allocator<char>::~allocator((allocator<char> *)&local_181);
      this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&mapProp.field_2 + 8);
      local_198._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
      local_1a0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this_00);
      s_00 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)context_local);
      cmsys::SystemTools::UpperCase(&local_1c0,s_00);
      local_190 = std::
                  find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                            (local_198,local_1a0,&local_1c0);
      local_1c8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&mapProp.field_2 + 8));
      bVar1 = __gnu_cxx::operator!=(&local_190,&local_1c8);
      if (bVar1) {
        local_268 = "1";
      }
      else {
        local_268 = "0";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,local_268,&local_1c9);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
      std::__cxx11::string::~string((string *)&local_1c0);
      local_1d0 = 1;
    }
    std::__cxx11::string::~string((string *)local_110);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&mapProp.field_2 + 8));
    if (local_1d0 == 0) goto LAB_006841e6;
  }
  else {
LAB_006841e6:
    local_1d0 = 0;
  }
  std::__cxx11::string::~string
            ((string *)
             &mappedConfigs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (local_1d0 != 0) {
    return __return_storage_ptr__;
  }
LAB_0068421a:
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"0",&local_1d1);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string> &parameters,
                       cmGeneratorExpressionContext *context,
                       const GeneratorExpressionContent *content,
                       cmGeneratorExpressionDAGChecker *) const
  {
    if (parameters.empty())
      {
      return configurationNode.Evaluate(parameters, context, content, 0);
      }
    static cmsys::RegularExpression configValidator("^[A-Za-z0-9_]*$");
    if (!configValidator.find(*parameters.begin()))
      {
      reportError(context, content->GetOriginalExpression(),
                  "Expression syntax not recognized.");
      return std::string();
      }
    context->HadContextSensitiveCondition = true;
    if (context->Config.empty())
      {
      return parameters.front().empty() ? "1" : "0";
      }

    if (cmsysString_strcasecmp(parameters.begin()->c_str(),
                               context->Config.c_str()) == 0)
      {
      return "1";
      }

    if (context->CurrentTarget
        && context->CurrentTarget->IsImported())
      {
      const char* loc = 0;
      const char* imp = 0;
      std::string suffix;
      if (context->CurrentTarget->Target->GetMappedConfig(context->Config,
                                                  &loc,
                                                  &imp,
                                                  suffix))
        {
        // This imported target has an appropriate location
        // for this (possibly mapped) config.
        // Check if there is a proper config mapping for the tested config.
        std::vector<std::string> mappedConfigs;
        std::string mapProp = "MAP_IMPORTED_CONFIG_";
        mapProp += cmSystemTools::UpperCase(context->Config);
        if(const char* mapValue =
                        context->CurrentTarget->GetProperty(mapProp))
          {
          cmSystemTools::ExpandListArgument(cmSystemTools::UpperCase(mapValue),
                                            mappedConfigs);
          return std::find(mappedConfigs.begin(), mappedConfigs.end(),
                           cmSystemTools::UpperCase(parameters.front()))
              != mappedConfigs.end() ? "1" : "0";
          }
        }
      }
    return "0";
  }